

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrabc_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d9d6d::IntrabcTest_DvValidation_Test::TestBody
          (IntrabcTest_DvValidation_Test *this)

{
  bool bVar1;
  int mi_row_00;
  int iVar2;
  AssertionResult gtest_ar;
  int mi_col;
  int mi_row;
  DvTestCase *dv_case;
  DvTestCase *__end1;
  DvTestCase *__begin1;
  DvTestCase (*__range1) [26];
  AV1_COMMON cm;
  SequenceHeader seq_params;
  MACROBLOCKD xd;
  DvTestCase kDvCases [26];
  int kTileMaxMibWidth;
  int kSubPelScale;
  AssertHelper *in_stack_ffffffffffff57b0;
  int *in_stack_ffffffffffff57b8;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffff57c8;
  int in_stack_ffffffffffff57cc;
  char *in_stack_ffffffffffff57d0;
  Type in_stack_ffffffffffff57dc;
  AssertHelper *in_stack_ffffffffffff57e0;
  AssertionResult local_a800;
  int local_a7f0;
  AV1_COMMON *pAVar3;
  AV1_COMMON *xd_00;
  AV1_COMMON *cm_00;
  AV1_COMMON *this_01;
  undefined1 local_a7c8 [8];
  int in_stack_ffffffffffff5840;
  undefined1 local_4420 [1944];
  undefined1 local_3c88 [12];
  undefined1 local_3c7c;
  int local_3244;
  int local_3240;
  undefined4 local_2814;
  undefined4 local_2810;
  int local_1de8;
  undefined4 local_1de4;
  int local_1de0;
  undefined4 local_1ddc;
  undefined1 local_1b8 [424];
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 8;
  local_10 = 8;
  memcpy(local_1b8,&DAT_0189bc60,0x1a0);
  memset(local_3c88,0,0x3ad0);
  local_1de8 = 0x100;
  local_1de4 = 0x200;
  local_1de0 = 0x300;
  local_1ddc = 0x400;
  local_3244 = 1;
  local_3240 = 1;
  local_2814 = 1;
  local_2810 = 1;
  memset(local_4420,0,0x798);
  memset(local_a7c8,0,0x63a0);
  xd_00 = (AV1_COMMON *)(local_1b8 + 0x1a0);
  pAVar3 = (AV1_COMMON *)local_1b8;
  this_01 = pAVar3;
  while (pAVar3 != xd_00) {
    mi_row_00 = local_1de8 + (pAVar3->current_frame).order_hint;
    local_a7f0 = local_1de0 + (pAVar3->current_frame).display_order_hint;
    cm_00 = pAVar3;
    iVar2 = is_chroma_reference(mi_row_00,local_a7f0,*(bool *)&(pAVar3->current_frame).pyramid_level
                                ,local_3244,local_3240);
    local_3c7c = iVar2 != 0;
    av1_is_dv_valid(SUB84(this_01,0),cm_00,(MACROBLOCKD *)xd_00,(int)((ulong)pAVar3 >> 0x20),
                    (int)pAVar3,(BLOCK_SIZE)((uint)mi_row_00 >> 0x18),in_stack_ffffffffffff5840);
    this_00 = &local_a800;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffff57cc,in_stack_ffffffffffff57c8),
               &this_00->success_,in_stack_ffffffffffff57b8,(int *)in_stack_ffffffffffff57b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    in_stack_ffffffffffff57cc = CONCAT13(bVar1,(int3)in_stack_ffffffffffff57cc);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffff57e0);
      in_stack_ffffffffffff57b8 =
           (int *)testing::AssertionResult::failure_message((AssertionResult *)0x46b769);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffff57e0,in_stack_ffffffffffff57dc,in_stack_ffffffffffff57d0,
                 in_stack_ffffffffffff57cc,&this_00->success_);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)cm_00);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffff57b0);
      testing::Message::~Message((Message *)0x46b7b7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x46b7f7);
    pAVar3 = (AV1_COMMON *)&(cm_00->current_frame).frame_number;
  }
  return;
}

Assistant:

TEST(IntrabcTest, DvValidation) {
  struct DvTestCase {
    MV dv;
    int mi_row_offset;
    int mi_col_offset;
    BLOCK_SIZE bsize;
    bool valid;
  };
  const int kSubPelScale = 8;
  const int kTileMaxMibWidth = 8;
  const DvTestCase kDvCases[] = {
    { { 0, 0 }, 0, 0, BLOCK_128X128, false },
    { { 0, 0 }, 0, 0, BLOCK_64X64, false },
    { { 0, 0 }, 0, 0, BLOCK_32X32, false },
    { { 0, 0 }, 0, 0, BLOCK_16X16, false },
    { { 0, 0 }, 0, 0, BLOCK_8X8, false },
    { { 0, 0 }, 0, 0, BLOCK_4X4, false },
    { { -MAX_SB_SIZE * kSubPelScale, -MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_16X16,
      true },
    { { 0, -MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_16X16,
      false },
    { { -MAX_SB_SIZE * kSubPelScale, 0 },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_16X16,
      true },
    { { MAX_SB_SIZE * kSubPelScale, 0 },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_16X16,
      false },
    { { 0, MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_16X16,
      false },
    { { -32 * kSubPelScale, -32 * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_32X32,
      true },
    { { -32 * kSubPelScale, -32 * kSubPelScale },
      32 / MI_SIZE,
      32 / MI_SIZE,
      BLOCK_32X32,
      false },
    { { -32 * kSubPelScale - kSubPelScale / 2, -32 * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_32X32,
      false },
    { { -33 * kSubPelScale, -32 * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_32X32,
      true },
    { { -32 * kSubPelScale, -32 * kSubPelScale - kSubPelScale / 2 },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_32X32,
      false },
    { { -32 * kSubPelScale, -33 * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_32X32,
      true },
    { { -MAX_SB_SIZE * kSubPelScale, -MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      true },
    { { -(MAX_SB_SIZE + 1) * kSubPelScale, -MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      false },
    { { -MAX_SB_SIZE * kSubPelScale, -(MAX_SB_SIZE + 1) * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      false },
    { { -(MAX_SB_SIZE - 1) * kSubPelScale, -MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      false },
    { { -MAX_SB_SIZE * kSubPelScale, -(MAX_SB_SIZE - 1) * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      true },
    { { -(MAX_SB_SIZE - 1) * kSubPelScale, -(MAX_SB_SIZE - 1) * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      false },
    { { -MAX_SB_SIZE * kSubPelScale, MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      false },
    { { -MAX_SB_SIZE * kSubPelScale,
        (kTileMaxMibWidth - 2) * MAX_SB_SIZE * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      false },
    { { -MAX_SB_SIZE * kSubPelScale,
        ((kTileMaxMibWidth - 2) * MAX_SB_SIZE + 1) * kSubPelScale },
      MAX_SB_SIZE / MI_SIZE,
      MAX_SB_SIZE / MI_SIZE,
      BLOCK_LARGEST,
      false },
  };

  MACROBLOCKD xd;
  memset(&xd, 0, sizeof(xd));
  xd.tile.mi_row_start = 8 * MAX_MIB_SIZE;
  xd.tile.mi_row_end = 16 * MAX_MIB_SIZE;
  xd.tile.mi_col_start = 24 * MAX_MIB_SIZE;
  xd.tile.mi_col_end = xd.tile.mi_col_start + kTileMaxMibWidth * MAX_MIB_SIZE;
  xd.plane[1].subsampling_x = 1;
  xd.plane[1].subsampling_y = 1;
  xd.plane[2].subsampling_x = 1;
  xd.plane[2].subsampling_y = 1;

  SequenceHeader seq_params = {};
  AV1_COMMON cm;
  memset(&cm, 0, sizeof(cm));
  cm.seq_params = &seq_params;

  for (const DvTestCase &dv_case : kDvCases) {
    const int mi_row = xd.tile.mi_row_start + dv_case.mi_row_offset;
    const int mi_col = xd.tile.mi_col_start + dv_case.mi_col_offset;
    xd.is_chroma_ref = is_chroma_reference(mi_row, mi_col, dv_case.bsize,
                                           xd.plane[1].subsampling_x,
                                           xd.plane[1].subsampling_y);
    EXPECT_EQ(static_cast<int>(dv_case.valid),
              av1_is_dv_valid(dv_case.dv, &cm, &xd, mi_row, mi_col,
                              dv_case.bsize, MAX_MIB_SIZE_LOG2));
  }
}